

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_blend_mode(rf_blend_mode mode)

{
  rf_blend_mode mode_local;
  
  rf_gfx_draw();
  if (mode == RF_BLEND_ALPHA) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BlendFunc)(0x302,0x303);
  }
  else if (mode == RF_BLEND_ADDITIVE) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BlendFunc)(0x302,1);
  }
  else if (mode == RF_BLEND_MULTIPLIED) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BlendFunc)(0x306,0x303);
  }
  (rf__ctx->field_0).blend_mode = mode;
  return;
}

Assistant:

RF_API void rf_gfx_blend_mode(rf_blend_mode mode)
{
    rf_gfx_draw();

    switch (mode)
    {
        case RF_BLEND_ALPHA: rf_gl.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA); break;
        case RF_BLEND_ADDITIVE: rf_gl.BlendFunc(GL_SRC_ALPHA, GL_ONE); break; // Alternative: glBlendFunc(GL_ONE, GL_ONE);
        case RF_BLEND_MULTIPLIED: rf_gl.BlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA); break;
        default: break;
    }

    rf_ctx.blend_mode = mode;
}